

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O0

void __thiscall
AI::SoundMap::injectSound
          (SoundMap *this,Vector2<float> originalPosition,float initialIntensity,AuditoryTag tag)

{
  undefined1 local_60 [8];
  SoundSource source;
  AuditoryTag tag_local;
  float initialIntensity_local;
  SoundMap *this_local;
  Vector2<float> originalPosition_local;
  
  source.tag = tag;
  source._60_4_ = initialIntensity;
  SoundSource::SoundSource((SoundSource *)local_60);
  local_60 = (undefined1  [8])calcGridCoordinates(originalPosition,this->resolution,this->gridSize);
  source.originalPosition.y = (float)this->nextSourceId;
  source.radius = source._60_4_;
  source.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = source.tag;
  source.gridCoordinates = (Vector2<int>)originalPosition;
  std::vector<AI::SoundSource,_std::allocator<AI::SoundSource>_>::push_back
            (&this->sources,(value_type *)local_60);
  this->nextSourceId = this->nextSourceId + 1;
  SoundSource::~SoundSource((SoundSource *)local_60);
  return;
}

Assistant:

void SoundMap::injectSound(Vector2<float> originalPosition, float initialIntensity, AuditoryTag tag)
	{			
		SoundSource source;
		source.gridCoordinates = calcGridCoordinates(originalPosition, resolution, gridSize);
		source.originalPosition = originalPosition;
		source.id = nextSourceId;
		source.initialIntensity = initialIntensity;
		source.tag = tag;

		sources.push_back(source);
		nextSourceId++;
	}